

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comp_io.cc
# Opt level: O1

void __thiscall comp_io_buf::reset_file(comp_io_buf *this,int f)

{
  char *pcVar1;
  
  gzseek64(*(undefined8 *)(*(long *)&this->gz_files + (long)f * 8),0,0);
  pcVar1 = (this->super_io_buf).space._begin;
  (this->super_io_buf).space._end = pcVar1;
  (this->super_io_buf).head = pcVar1;
  return;
}

Assistant:

void comp_io_buf::reset_file(int f)
{
  gzFile fil = gz_files[f];
  gzseek(fil, 0, SEEK_SET);
  space.end() = space.begin();
  head = space.begin();
}